

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ParseObjectChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  Scene *this_01;
  int8_t *piVar1;
  int8_t iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_type value;
  Logger *this_02;
  ulong uVar6;
  float fVar7;
  allocator local_361;
  string local_360 [32];
  int8_t *local_340;
  char *sz_1;
  uint cnt_1;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  Material local_2e8;
  int8_t *local_30;
  char *sz;
  uint local_20;
  uint cnt;
  uint oldReadLimit;
  int chunkSize;
  Discreet3DSImporter *pDStack_10;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_10 = this;
  do {
    do {
      uVar4 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar4 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      cnt = chunkSize - 6;
    } while ((int)cnt < 1);
    this_00 = this->stream;
    iVar5 = StreamReader<false,_false>::GetCurrentPos(this_00);
    local_20 = StreamReader<false,_false>::SetReadLimit(this_00,iVar5 + cnt);
    if (oldReadLimit._2_2_ == 0x100) {
      fVar7 = StreamReader<false,_false>::GetF4(this->stream);
      this->mMasterScale = fVar7;
    }
    else if (oldReadLimit._2_2_ == 0x1100) {
      sz_1._0_4_ = 0;
      local_340 = StreamReader<false,_false>::GetPtr(this->stream);
      while (iVar2 = StreamReader<false,_false>::GetI1(this->stream), piVar1 = local_340,
            iVar2 != '\0') {
        sz_1._0_4_ = (uint)sz_1 + 1;
      }
      uVar6 = (ulong)(uint)sz_1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_360,piVar1,uVar6,&local_361);
      std::__cxx11::string::operator=((string *)&this->mBackgroundImage,local_360);
      std::__cxx11::string::~string(local_360);
      std::allocator<char>::~allocator((allocator<char> *)&local_361);
    }
    else if (oldReadLimit._2_2_ == 0x1101) {
      this->bHasBG = true;
    }
    else if (oldReadLimit._2_2_ == 0x2100) {
      ParseColorChunk(this,&this->mClrAmbient,true);
      bVar3 = is_qnan((this->mClrAmbient).r);
      if (bVar3) {
        this_02 = DefaultLogger::get();
        Logger::error(this_02,"3DS: Failed to read ambient base color");
        (this->mClrAmbient).b = 0.0;
        (this->mClrAmbient).g = 0.0;
        (this->mClrAmbient).r = 0.0;
      }
    }
    else if (oldReadLimit._2_2_ == 0x4000) {
      sz._4_4_ = 0;
      local_30 = StreamReader<false,_false>::GetPtr(this->stream);
      while (iVar2 = StreamReader<false,_false>::GetI1(this->stream), iVar2 != '\0') {
        sz._4_4_ = sz._4_4_ + 1;
      }
      ParseChunk(this,local_30,sz._4_4_);
    }
    else if (oldReadLimit._2_2_ == -0x5001) {
      this_01 = this->mScene;
      value = std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::size
                        (&this_01->mMaterials);
      to_string<unsigned_long>(&local_328,value);
      std::operator+(&local_308,"UNNAMED_",&local_328);
      D3DS::Material::Material(&local_2e8,&local_308);
      std::vector<Assimp::D3DS::Material,_std::allocator<Assimp::D3DS::Material>_>::push_back
                (&this_01->mMaterials,&local_2e8);
      D3DS::Material::~Material(&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      ParseMaterialChunk(this);
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,local_20);
    uVar4 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
  } while (uVar4 != 0);
  return;
}

Assistant:

void Discreet3DSImporter::ParseObjectChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_OBJBLOCK:
        {
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();

        // Get the name of the geometry object
        while (stream->GetI1())++cnt;
        ParseChunk(sz,cnt);
        }
        break;

    case Discreet3DS::CHUNK_MAT_MATERIAL:

        // Add a new material to the list
        mScene->mMaterials.push_back(D3DS::Material(std::string("UNNAMED_" + to_string(mScene->mMaterials.size()))));
        ParseMaterialChunk();
        break;

    case Discreet3DS::CHUNK_AMBCOLOR:

        // This is the ambient base color of the scene.
        // We add it to the ambient color of all materials
        ParseColorChunk(&mClrAmbient,true);
        if (is_qnan(mClrAmbient.r))
        {
            // We failed to read the ambient base color.
            ASSIMP_LOG_ERROR("3DS: Failed to read ambient base color");
            mClrAmbient.r = mClrAmbient.g = mClrAmbient.b = 0.0f;
        }
        break;

    case Discreet3DS::CHUNK_BIT_MAP:
        {
        // Specifies the background image. The string should already be
        // properly 0 terminated but we need to be sure
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();
        while (stream->GetI1())++cnt;
        mBackgroundImage = std::string(sz,cnt);
        }
        break;

    case Discreet3DS::CHUNK_BIT_MAP_EXISTS:
        bHasBG = true;
        break;

    case Discreet3DS::CHUNK_MASTER_SCALE:
        // Scene master scaling factor
        mMasterScale = stream->GetF4();
        break;
    };
    ASSIMP_3DS_END_CHUNK();
}